

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QMimeData * __thiscall QTableModel::mimeData(QTableModel *this,QModelIndexList *indexes)

{
  int iVar1;
  QTableWidgetItem *t;
  QTableWidget *pQVar2;
  QMimeData *pQVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QTableWidgetItem_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  local_48.ptr = (QTableWidgetItem **)0x0;
  uVar4 = (indexes->d).size;
  iVar1 = (int)uVar4;
  QList<QTableWidgetItem_*>::reserve((QList<QTableWidgetItem_*> *)&local_48,(long)iVar1);
  uVar5 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 * 0x18 - uVar5 != 0; uVar5 = uVar5 + 0x18) {
    t = item(this,(QModelIndex *)((long)&((indexes->d).ptr)->r + uVar5));
    QList<QTableWidgetItem_*>::append((QList<QTableWidgetItem_*> *)&local_48,t);
  }
  pQVar2 = view(this);
  QArrayDataPointer<QModelIndex>::operator=(&(this->cachedIndexes).d,&indexes->d);
  if (pQVar2 == (QTableWidget *)0x0) {
    pQVar3 = (QMimeData *)0x0;
  }
  else {
    pQVar3 = (QMimeData *)
             (**(code **)(*(long *)&(pQVar2->super_QTableView).super_QAbstractItemView.
                                    super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x308))
                       (pQVar2,&local_48);
  }
  QList<QModelIndex>::clear(&this->cachedIndexes);
  QArrayDataPointer<QTableWidgetItem_*>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QTableModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QTableWidgetItem*> items;
    const int indexesCount = indexes.size();
    items.reserve(indexesCount);
    for (int i = 0; i < indexesCount; ++i)
        items << item(indexes.at(i));
    const QTableWidget *view = this->view();

    // cachedIndexes is a little hack to avoid copying from QModelIndexList to
    // QList<QTreeWidgetItem*> and back again in the view
    cachedIndexes = indexes;
    QMimeData *mimeData = (view ? view->mimeData(items) : nullptr);
    cachedIndexes.clear();
    return mimeData;
}